

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imath_3_2::Vec2<int>_> * __thiscall
Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
          (Header *this,char *name)

{
  Attribute *pAVar1;
  TypeExc *this_00;
  TypedAttribute<Imath_3_2::Vec2<int>_> *tattr;
  Attribute *attr;
  char *in_stack_00000278;
  Header *in_stack_00000280;
  TypedAttribute<Imath_3_2::Vec2<int>_> *local_40;
  
  pAVar1 = operator[](in_stack_00000280,in_stack_00000278);
  if (pAVar1 == (Attribute *)0x0) {
    local_40 = (TypedAttribute<Imath_3_2::Vec2<int>_> *)0x0;
  }
  else {
    local_40 = (TypedAttribute<Imath_3_2::Vec2<int>_> *)
               __dynamic_cast(pAVar1,&Attribute::typeinfo,
                              &TypedAttribute<Imath_3_2::Vec2<int>>::typeinfo,0);
  }
  if (local_40 == (TypedAttribute<Imath_3_2::Vec2<int>_> *)0x0) {
    this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
    __cxa_throw(this_00,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
  }
  return local_40;
}

Assistant:

const T&
Header::typedAttribute (const char name[]) const
{
    const Attribute* attr  = &(*this)[name];
    const T*         tattr = dynamic_cast<const T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}